

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_decoder.hpp
# Opt level: O2

bool __thiscall
jsoncons::
json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
::visit_int64(json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
              *this,int64_t value,semantic_tag tag,ser_context *param_3,error_code *param_4)

{
  structure_type sVar1;
  semantic_tag local_29;
  int64_t local_28;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
  local_20;
  
  sVar1 = (this->structure_stack_).
          super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].type_;
  local_29 = tag;
  local_28 = value;
  if (sVar1 - array_t < 2) {
    local_20._0_8_ = this->index_;
    this->index_ = local_20._0_8_ + 1;
    std::
    vector<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
    ::emplace_back<std::__cxx11::string,unsigned_long,long&,jsoncons::semantic_tag&>
              ((vector<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                *)&this->item_stack_,&this->name_,(unsigned_long *)&local_20,&local_28,&local_29);
  }
  else if (sVar1 == root_t) {
    local_20.common_.tag_ = tag;
    local_20.json_ref_ = (json_reference_storage)2;
    local_20.int64_.val_ = value;
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::operator=
              (&this->result_,
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               &local_20.common_);
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               &local_20.common_);
    this->is_valid_ = true;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_int64(int64_t value, 
        semantic_tag tag, 
        const ser_context&,
        std::error_code&) override
    {
        switch (structure_stack_.back().type_)
        {
            case structure_type::object_t:
            case structure_type::array_t:
                item_stack_.emplace_back(std::move(name_), index_++, value, tag);
                break;
            case structure_type::root_t:
                result_ = Json(value,tag);
                is_valid_ = true;
                JSONCONS_VISITOR_RETURN;
        }
        JSONCONS_VISITOR_RETURN;
    }